

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_816508::CheckLinkLibraryPattern
          (anon_unknown_dwarf_816508 *this,string_view property,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *value,cmake *context)

{
  string_view view;
  bool bVar1;
  int iVar2;
  string local_128;
  string local_108;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_e8;
  size_t sStack_e0;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  string local_78;
  reference local_58;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  bool isValid;
  cmake *context_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *value_local;
  string_view property_local;
  
  property_local._M_len = property._M_len;
  value_local = (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this;
  if (((anonymous_namespace)::
       CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
       ::linkPattern == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
                                   ::linkPattern), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&CheckLinkLibraryPattern::linkPattern,"(^|;)(</?LINK_(LIBRARY|GROUP):[^;>]*>)(;|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&CheckLinkLibraryPattern::linkPattern,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
                         ::linkPattern);
  }
  __range1._3_1_ = true;
  __end1 = std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)property._M_str);
  item = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         std::
         vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)property._M_str);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&item), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
    bVar1 = cmsys::RegularExpression::find(&CheckLinkLibraryPattern::linkPattern,&local_58->Value);
    if (bVar1) {
      __range1._3_1_ = false;
      cmAlphaNum::cmAlphaNum(&local_a8,"Property ");
      local_e8 = value_local;
      sStack_e0 = property_local._M_len;
      view._M_str = (char *)property_local._M_len;
      view._M_len = (size_t)value_local;
      cmAlphaNum::cmAlphaNum(&local_d8,view);
      cmsys::RegularExpression::match_abi_cxx11_(&local_108,&CheckLinkLibraryPattern::linkPattern,2)
      ;
      cmsys::RegularExpression::match_abi_cxx11_(&local_128,&CheckLinkLibraryPattern::linkPattern,3)
      ;
      cmStrCat<char[29],std::__cxx11::string,char[8],std::basic_string_view<char,std::char_traits<char>>,char[56],std::__cxx11::string,char[66]>
                (&local_78,&local_a8,&local_d8,(char (*) [29])" contains the invalid item \"",
                 &local_108,(char (*) [8])"\". The ",
                 (basic_string_view<char,_std::char_traits<char>_> *)&value_local,
                 (char (*) [56])" property may contain the generator-expression \"$<LINK_",
                 &local_128,
                 (char (*) [66])":...>\" which may be used to specify how the libraries are linked."
                );
      cmake::IssueMessage((cmake *)value,FATAL_ERROR,&local_78,&local_58->Backtrace);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_108);
    }
    __gnu_cxx::
    __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._3_1_;
}

Assistant:

bool CheckLinkLibraryPattern(cm::string_view property,
                             const std::vector<BT<std::string>>& value,
                             cmake* context)
{
  // Look for <LINK_LIBRARY:> and </LINK_LIBRARY:> internal tags
  static cmsys::RegularExpression linkPattern(
    "(^|;)(</?LINK_(LIBRARY|GROUP):[^;>]*>)(;|$)");

  bool isValid = true;

  for (const auto& item : value) {
    if (!linkPattern.find(item.Value)) {
      continue;
    }

    isValid = false;

    // Report an error.
    context->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Property ", property, " contains the invalid item \"",
        linkPattern.match(2), "\". The ", property,
        " property may contain the generator-expression \"$<LINK_",
        linkPattern.match(3),
        ":...>\" which may be used to specify how the libraries are linked."),
      item.Backtrace);
  }

  return isValid;
}